

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O3

uintptr_t tlp_mr_addr(tlp_mr_hdr *mh)

{
  tlp_hdr tVar1;
  tlp_mr_hdr tVar2;
  uintptr_t uVar3;
  uint uVar4;
  long lVar5;
  
  if (((mh->tlp).fmt_type & 0x20) == 0) {
    tVar1 = mh[1].tlp;
    uVar3 = (uintptr_t)
            ((uint)tVar1 >> 0x18 | ((uint)tVar1 & 0xff0000) >> 8 | ((uint)tVar1 & 0xff00) << 8 |
            (int)tVar1 << 0x18);
  }
  else {
    tVar2 = mh[1];
    uVar3 = (ulong)tVar2 >> 0x38 | ((ulong)tVar2 & 0xff000000000000) >> 0x28 |
            ((ulong)tVar2 & 0xff0000000000) >> 0x18 | ((ulong)tVar2 & 0xff00000000) >> 8 |
            ((ulong)tVar2 & 0xff000000) << 8 | ((ulong)tVar2 & 0xff0000) << 0x18 |
            ((ulong)tVar2 & 0xff00) << 0x28 | (long)tVar2 << 0x38;
  }
  uVar4 = (byte)mh->field_0x7 & 0xf;
  if (((mh->field_0x7 & 0xf) != 0) && (uVar4 != 0xf)) {
    lVar5 = 0;
    while ((uVar4 >> ((uint)lVar5 & 0x1f) & 1) == 0) {
      lVar5 = lVar5 + 1;
      if ((int)lVar5 == 4) {
        return uVar3 + 4;
      }
    }
    uVar3 = uVar3 + lVar5;
  }
  return uVar3;
}

Assistant:

uintptr_t tlp_mr_addr(struct tlp_mr_hdr *mh)
{
	int n;
	uintptr_t addr;
	uint32_t *addr32;
	uint64_t *addr64;

	if (tlp_is_3dw(mh->tlp.fmt_type)) {
		addr32 = (uint32_t *)(mh + 1);
		addr = be32toh(*addr32);
	} else {
		addr64 = (uint64_t *)(mh + 1);
		addr = be64toh(*addr64);
	}
	
	/* move forard the address in accordance with the 1st DW BE */
	if (mh->fstdw && mh->fstdw != 0xF) {
		for (n = 0; n < 4; n++) {
			if ((mh->fstdw & (0x1 << n)) == 0) {
				addr += 1;
			} else
				break;
		}
	}

	return addr;
}